

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O2

void __thiscall
front::word::Word::Word(Word *this,Token in_token_value,string *in_self,uint in_line_num)

{
  (this->self)._M_dataplus._M_p = (pointer)&(this->self).field_2;
  (this->self)._M_string_length = 0;
  (this->self).field_2._M_local_buf[0] = '\0';
  this->token_value = in_token_value;
  std::__cxx11::string::_M_assign((string *)&this->self);
  this->line_num = in_line_num;
  return;
}

Assistant:

Word::Word(Token in_token_value, string in_self, unsigned int in_line_num) {
  token_value = in_token_value;
  self = in_self;
  line_num = in_line_num;
}